

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O0

_Bool effect_handler_TELEPORT_LEVEL(effect_handler_context_t_conflict *context)

{
  bool bVar1;
  bool bVar2;
  _Bool _Var3;
  wchar_t wVar4;
  uint32_t uVar5;
  monster *mon;
  loc_conflict lVar6;
  wchar_t local_30;
  wchar_t wStack_2c;
  loc_conflict decoy;
  monster *t_mon;
  wchar_t target_depth;
  _Bool down;
  _Bool up;
  effect_handler_context_t_conflict *context_local;
  
  bVar1 = true;
  bVar2 = true;
  wVar4 = dungeon_get_next_level(player,(int)player->max_depth,L'\x01');
  mon = monster_target_monster(context);
  lVar6 = (loc_conflict)cave_find_decoy(cave);
  context->ident = true;
  if ((player->upkeep->arena_level & 1U) == 0) {
    if (mon == (monster *)0x0) {
      wStack_2c = lVar6.y;
      if ((wStack_2c == L'\0') || (local_30 = lVar6.x, local_30 == L'\0')) {
        lVar6.x = (player->grid).x;
        lVar6.y = (player->grid).y;
        _Var3 = square_isno_teleport((chunk *)cave,lVar6);
        if (_Var3) {
          msg("Teleportation forbidden!");
        }
        else {
          _Var3 = player_of_has(player,L'\x19');
          if (_Var3) {
            equip_learn_flag(player,L'\x19');
            msg("Teleportation forbidden!");
          }
          else if (((context->origin).what == SRC_MONSTER) &&
                  (_Var3 = player_resists(player,L'\t'), _Var3)) {
            msg("You resist the effect!");
          }
          else {
            if ((((player->opts).opt[0x20] & 1U) != 0) || (player->depth == 0)) {
              bVar1 = false;
            }
            if ((!bVar1) && (_Var3 = is_quest(player,wVar4), _Var3)) {
              bVar2 = false;
            }
            _Var3 = is_quest(player,(int)player->depth);
            if ((_Var3) || ((int)(z_info->max_depth - 1) <= (int)player->depth)) {
              bVar2 = false;
            }
            if ((bVar1) && (bVar2)) {
              uVar5 = Rand_div(100);
              if ((int)uVar5 < 0x32) {
                bVar1 = false;
              }
              else {
                bVar2 = false;
              }
            }
            if (bVar1) {
              msgt(0x19,"You rise up through the ceiling.");
              cmdq_flush();
              wVar4 = dungeon_get_next_level(player,(int)player->depth,L'\xffffffff');
              dungeon_change_level(player,wVar4);
            }
            else if (bVar2) {
              msgt(0x19,"You sink through the floor.");
              cmdq_flush();
              if (((player->opts).opt[0x20] & 1U) == 0) {
                wVar4 = dungeon_get_next_level(player,(int)player->depth,L'\x01');
                dungeon_change_level(player,wVar4);
              }
              else {
                wVar4 = dungeon_get_next_level(player,(int)player->max_depth,L'\x01');
                dungeon_change_level(player,wVar4);
              }
            }
            else {
              msg("Nothing happens.");
            }
          }
        }
      }
      else {
        square_destroy_decoy((chunk *)cave,lVar6);
      }
    }
    else {
      add_monster_message(mon,L'\x15',false);
      delete_monster_idx((chunk *)cave,mon->midx);
    }
  }
  return true;
}

Assistant:

bool effect_handler_TELEPORT_LEVEL(effect_handler_context_t *context)
{
	bool up = true;
	bool down = true;
	int target_depth = dungeon_get_next_level(player, player->max_depth, 1);
	struct monster *t_mon = monster_target_monster(context);
	struct loc decoy = cave_find_decoy(cave);

	context->ident = true;

	/* No teleporting in arena levels */
	if (player->upkeep->arena_level) return true;

	/* Check for monster targeting another monster */
	if (t_mon) {
		/* Monster is just gone */
		add_monster_message(t_mon, MON_MSG_DISAPPEAR, false);
		delete_monster_idx(cave, t_mon->midx);
		return true;
	}

	/* Targeted decoys get destroyed */
	if (decoy.y && decoy.x) {
		square_destroy_decoy(cave, decoy);
		return true;
	}

	/* Check for a no teleport grid */
	if (square_isno_teleport(cave, player->grid)) {
		msg("Teleportation forbidden!");
		return true;
	}

	/* Check for a no teleport curse */
	if (player_of_has(player, OF_NO_TELEPORT)) {
		equip_learn_flag(player, OF_NO_TELEPORT);
		msg("Teleportation forbidden!");
		return true;
	}

	/* Resist hostile teleport */
	if (context->origin.what == SRC_MONSTER &&
			player_resists(player, ELEM_NEXUS)) {
		msg("You resist the effect!");
		return true;
	}

	/* No going up with force_descend or in the town */
	if (OPT(player, birth_force_descend) || !player->depth)
		up = false;

	/* No forcing player down to quest levels if they can't leave */
	if (!up && is_quest(player, target_depth))
		down = false;

	/* Can't leave quest levels or go down deeper than the dungeon */
	if (is_quest(player, player->depth)
			|| (player->depth >= z_info->max_depth - 1))
		down = false;

	/* Determine up/down if not already done */
	if (up && down) {
		if (randint0(100) < 50)
			up = false;
		else
			down = false;
	}

	/*
	 * Now actually do the level change; flush the command queue to
	 * prevent the character from losing an action when first entering
	 * the new level (for instance, player moves putting an autopickup
	 * command in the queue and is then hit by a teleport level spell)
	 */
	if (up) {
		msgt(MSG_TPLEVEL, "You rise up through the ceiling.");
		cmdq_flush();
		target_depth = dungeon_get_next_level(player,
			player->depth, -1);
		dungeon_change_level(player, target_depth);
	} else if (down) {
		msgt(MSG_TPLEVEL, "You sink through the floor.");

		cmdq_flush();
		if (OPT(player, birth_force_descend)) {
			target_depth = dungeon_get_next_level(player,
				player->max_depth, 1);
			dungeon_change_level(player, target_depth);
		} else {
			target_depth = dungeon_get_next_level(player,
				player->depth, 1);
			dungeon_change_level(player, target_depth);
		}
	} else {
		msg("Nothing happens.");
	}

	return true;
}